

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QObject*,QPointer<QHttp2Stream>>::emplace<QPointer<QHttp2Stream>const&>
          (QHash<QObject*,QPointer<QHttp2Stream>> *this,QObject **key,QPointer<QHttp2Stream> *args)

{
  Data *pDVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QWeakPointer<QObject> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_30.d = (Data *)0x0;
LAB_001e5ea2:
    QHash<QObject_*,_QPointer<QHttp2Stream>_>::detach
              ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)this);
    pVar3 = (piter)emplace_helper<QPointer<QHttp2Stream>const&>(this,key,args);
    QHash<QObject_*,_QPointer<QHttp2Stream>_>::~QHash
              ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)&local_30);
  }
  else {
    if (1 < (uint)(pDVar1->weakref)._q_value.super___atomic_base<int>._M_i) {
      local_30.d = pDVar1;
      if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_001e5ea2;
    }
    uVar2._0_4_ = pDVar1[1].weakref;
    uVar2._4_4_ = pDVar1[1].strongref;
    if (pDVar1->destroyer < (DestroyerFn)(uVar2 >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QPointer<QHttp2Stream>const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_001e5f24;
    }
    local_30.d = (args->wp).d;
    local_30.value = (args->wp).value;
    if (local_30.d != (Data *)0x0) {
      LOCK();
      ((local_30.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_30.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar3 = (piter)emplace_helper<QPointer<QHttp2Stream>>
                             (this,key,(QPointer<QHttp2Stream> *)&local_30);
    QWeakPointer<QObject>::~QWeakPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_001e5f24:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }